

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O1

void __thiscall IRT::ChildrenAnswers::PushBack(ChildrenAnswers *this,string *description,int id)

{
  iterator __position;
  int local_c;
  
  local_c = id;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->descriptions,description);
  __position._M_current =
       (this->ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this->ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->ids,__position,&local_c);
  }
  else {
    *__position._M_current = local_c;
    (this->ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void IRT::ChildrenAnswers::PushBack( std::string description, int id ) {
    this->descriptions.push_back( description );
    this->ids.push_back( id );
}